

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GraphBuilder.cpp
# Opt level: O0

bool __thiscall
dg::llvmdg::legacy::GraphBuilder::createPthreadJoin
          (GraphBuilder *this,CallInst *callInst,Block *lastBlock)

{
  bool bVar1;
  iterator this_00;
  reference ppVVar2;
  Function *function;
  GraphBuilder *in_RDI;
  Function *func;
  Function *llvmFunction;
  Value *joinFunction;
  iterator __end2;
  iterator __begin2;
  vector<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_> *__range2;
  vector<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_> joinFunctions;
  ForkJoinAnalysis FJA;
  bool createCallReturn;
  vector<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_> *in_stack_ffffffffffffff78;
  undefined7 in_stack_ffffffffffffff80;
  undefined1 in_stack_ffffffffffffff87;
  Function *in_stack_ffffffffffffff90;
  Value *llvmFunction_00;
  __normal_iterator<const_llvm::Value_**,_std::vector<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_>_>
  local_50;
  Value *local_48;
  Value local_40 [24];
  ForkJoinAnalysis local_28;
  byte local_19;
  
  local_19 = 0;
  ForkJoinAnalysis::ForkJoinAnalysis(&local_28,in_RDI->pointsToAnalysis_);
  dg::ForkJoinAnalysis::joinFunctions(local_40);
  local_48 = local_40;
  local_50._M_current =
       (Value **)
       std::vector<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_>::begin
                 (in_stack_ffffffffffffff78);
  this_00 = std::vector<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_>::end
                      (in_stack_ffffffffffffff78);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<const_llvm::Value_**,_std::vector<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_>_>
                        *)CONCAT17(in_stack_ffffffffffffff87,in_stack_ffffffffffffff80),
                       (__normal_iterator<const_llvm::Value_**,_std::vector<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_>_>
                        *)in_stack_ffffffffffffff78);
    if (!bVar1) break;
    ppVVar2 = __gnu_cxx::
              __normal_iterator<const_llvm::Value_**,_std::vector<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_>_>
              ::operator*(&local_50);
    llvmFunction_00 = *ppVVar2;
    function = (Function *)llvm::cast<llvm::Function,llvm::Value_const>((Value *)0x21d7b8);
    bVar1 = llvm::Function::empty((Function *)0x21d7c7);
    if (!bVar1) {
      in_stack_ffffffffffffff90 =
           createOrGetFunction(in_RDI,(Function *)
                                      CONCAT17(in_stack_ffffffffffffff87,in_stack_ffffffffffffff80))
      ;
      Block::addJoin((Block *)this_00._M_current,(Function *)llvmFunction_00,function);
      local_19 = 1;
    }
    __gnu_cxx::
    __normal_iterator<const_llvm::Value_**,_std::vector<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_>_>
    ::operator++(&local_50);
  }
  std::vector<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_>::~vector
            ((vector<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_> *)
             in_stack_ffffffffffffff90);
  return (bool)(local_19 & 1);
}

Assistant:

bool GraphBuilder::createPthreadJoin(const llvm::CallInst *callInst,
                                     Block *lastBlock) {
    bool createCallReturn = false;

    // FIXME: create this as attibute so that we perform the analysis only once
    // (now we do not care as we just forward the results of PTA, but in the
    // future...)
    ForkJoinAnalysis FJA{pointsToAnalysis_};
    auto joinFunctions = FJA.joinFunctions(callInst);
    for (const auto *joinFunction : joinFunctions) {
        const auto *llvmFunction = llvm::cast<llvm::Function>(joinFunction);
        if (!llvmFunction->empty()) {
            auto *func = createOrGetFunction(llvmFunction);
            lastBlock->addJoin(llvmFunction, func);
            createCallReturn |= true;
        }
    }
    return createCallReturn;
}